

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float ImGui::CalcWrapWidthForPos(ImVec2 *pos,float wrap_pos_x)

{
  ImGuiWindow_conflict *pIVar1;
  float fVar2;
  
  fVar2 = 0.0;
  if (0.0 <= wrap_pos_x) {
    pIVar1 = GImGui->CurrentWindow;
    if ((wrap_pos_x != 0.0) || (NAN(wrap_pos_x))) {
      if (0.0 < wrap_pos_x) {
        wrap_pos_x = wrap_pos_x + ((pIVar1->Pos).x - (pIVar1->Scroll).x);
      }
    }
    else {
      wrap_pos_x = (pIVar1->WorkRect).Max.x;
    }
    fVar2 = wrap_pos_x - pos->x;
    if (fVar2 <= 1.0) {
      fVar2 = 1.0;
    }
  }
  return fVar2;
}

Assistant:

float ImGui::CalcWrapWidthForPos(const ImVec2& pos, float wrap_pos_x)
{
    if (wrap_pos_x < 0.0f)
        return 0.0f;

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (wrap_pos_x == 0.0f)
    {
        // We could decide to setup a default wrapping max point for auto-resizing windows,
        // or have auto-wrap (with unspecified wrapping pos) behave as a ContentSize extending function?
        //if (window->Hidden && (window->Flags & ImGuiWindowFlags_AlwaysAutoResize))
        //    wrap_pos_x = ImMax(window->WorkRect.Min.x + g.FontSize * 10.0f, window->WorkRect.Max.x);
        //else
        wrap_pos_x = window->WorkRect.Max.x;
    }
    else if (wrap_pos_x > 0.0f)
    {
        wrap_pos_x += window->Pos.x - window->Scroll.x; // wrap_pos_x is provided is window local space
    }

    return ImMax(wrap_pos_x - pos.x, 1.0f);
}